

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O0

void __thiscall Timidity::Instrument::~Instrument(Instrument *this)

{
  int local_1c;
  Sample *pSStack_18;
  int i;
  Sample *sp;
  Instrument *this_local;
  
  pSStack_18 = this->sample;
  for (local_1c = this->samples; local_1c != 0; local_1c = local_1c + -1) {
    if ((pSStack_18->type == '\0') && (pSStack_18->data != (sample_t *)0x0)) {
      free(pSStack_18->data);
    }
    pSStack_18 = pSStack_18 + 1;
  }
  free(this->sample);
  return;
}

Assistant:

Instrument::~Instrument()
{
	Sample *sp;
	int i;

	for (i = samples, sp = &(sample[0]); i != 0; i--, sp++)
	{
		if (sp->type == INST_GUS && sp->data != NULL)
		{
			free(sp->data);
		}
	}
	free(sample);
}